

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlCtxtParseEntity(xmlParserCtxtPtr ctxt,xmlEntityPtr ent)

{
  xmlEntityType xVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  xmlParserInputPtr input;
  xmlNodePtr pxVar6;
  xmlNodePtr tree;
  ulong uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  uint local_38;
  
  xVar1 = ent->etype;
  pxVar6 = ctxt->node;
  if ((ent->flags & 8) == 0) {
    local_38 = (uint)(xVar1 == XML_EXTERNAL_GENERAL_PARSED_ENTITY);
    input = xmlNewEntityInputStream(ctxt,ent);
    if (input != (xmlParserInputPtr)0x0) {
      iVar2 = ctxt->nsdb->minNsIndex;
      if (pxVar6 != (xmlNodePtr)0x0) {
        ctxt->nsdb->minNsIndex = ctxt->nsNr;
      }
      *(byte *)&ent->flags = (byte)ent->flags | 8;
      iVar4 = ctxt->nodelen;
      iVar5 = ctxt->nodemem;
      ctxt->nodelen = 0;
      ctxt->nodemem = 0;
      pxVar6 = xmlCtxtParseContentInternal(ctxt,input,local_38,(uint)(pxVar6 != (xmlNodePtr)0x0));
      uVar3 = ent->flags;
      ent->flags = uVar3 & 0xfffffff7;
      ctxt->nsdb->minNsIndex = iVar2;
      ctxt->nodelen = iVar4;
      ctxt->nodemem = iVar5;
      uVar7 = (long)input->end - (long)input->base;
      uVar8 = uVar7 + input->consumed;
      if (CARRY8(uVar7,input->consumed)) {
        uVar8 = 0xffffffffffffffff;
      }
      if ((uVar3 & 2) == 0) {
        uVar9 = ent->expandedSize + uVar8;
        if (CARRY8(ent->expandedSize,uVar8)) {
          uVar9 = 0xffffffffffffffff;
        }
        ent->expandedSize = uVar9;
      }
      if ((uVar3 & 1) == 0) {
        if (xVar1 == XML_EXTERNAL_GENERAL_PARSED_ENTITY) {
          uVar9 = 0xffffffffffffffff;
          if (!CARRY8(uVar8,ctxt->sizeentities)) {
            uVar9 = uVar8 + ctxt->sizeentities;
          }
          ctxt->sizeentities = uVar9;
        }
        ent->children = pxVar6;
        if (pxVar6 != (xmlNodePtr)0x0) {
          do {
            tree = pxVar6;
            tree->parent = (_xmlNode *)ent;
            if (tree->doc != ent->doc) {
              xmlSetTreeDoc(tree,ent->doc);
            }
            pxVar6 = tree->next;
          } while (tree->next != (_xmlNode *)0x0);
          ent->last = tree;
        }
      }
      else {
        xmlFreeNodeList(pxVar6);
      }
      xmlFreeInputStream(input);
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
    xmlHaltParser(ctxt);
  }
  *(byte *)&ent->flags = (byte)ent->flags | 3;
  return;
}

Assistant:

static void
xmlCtxtParseEntity(xmlParserCtxtPtr ctxt, xmlEntityPtr ent) {
    xmlParserInputPtr input;
    xmlNodePtr list;
    unsigned long consumed;
    int isExternal;
    int buildTree;
    int oldMinNsIndex;
    int oldNodelen, oldNodemem;

    isExternal = (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY);
    buildTree = (ctxt->node != NULL);

    /*
     * Recursion check
     */
    if (ent->flags & XML_ENT_EXPANDING) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
        xmlHaltParser(ctxt);
        goto error;
    }

    /*
     * Load entity
     */
    input = xmlNewEntityInputStream(ctxt, ent);
    if (input == NULL)
        goto error;

    /*
     * When building a tree, we need to limit the scope of namespace
     * declarations, so that entities don't reference xmlNs structs
     * from the parent of a reference.
     */
    oldMinNsIndex = ctxt->nsdb->minNsIndex;
    if (buildTree)
        ctxt->nsdb->minNsIndex = ctxt->nsNr;

    oldNodelen = ctxt->nodelen;
    oldNodemem = ctxt->nodemem;
    ctxt->nodelen = 0;
    ctxt->nodemem = 0;

    /*
     * Parse content
     *
     * This initiates a recursive call chain:
     *
     * - xmlCtxtParseContentInternal
     * - xmlParseContentInternal
     * - xmlParseReference
     * - xmlCtxtParseEntity
     *
     * The nesting depth is limited by the maximum number of inputs,
     * see xmlCtxtPushInput.
     *
     * It's possible to make this non-recursive (minNsIndex must be
     * stored in the input struct) at the expense of code readability.
     */

    ent->flags |= XML_ENT_EXPANDING;

    list = xmlCtxtParseContentInternal(ctxt, input, isExternal, buildTree);

    ent->flags &= ~XML_ENT_EXPANDING;

    ctxt->nsdb->minNsIndex = oldMinNsIndex;
    ctxt->nodelen = oldNodelen;
    ctxt->nodemem = oldNodemem;

    /*
     * Entity size accounting
     */
    consumed = input->consumed;
    xmlSaturatedAddSizeT(&consumed, input->end - input->base);

    if ((ent->flags & XML_ENT_CHECKED) == 0)
        xmlSaturatedAdd(&ent->expandedSize, consumed);

    if ((ent->flags & XML_ENT_PARSED) == 0) {
        if (isExternal)
            xmlSaturatedAdd(&ctxt->sizeentities, consumed);

        ent->children = list;

        while (list != NULL) {
            list->parent = (xmlNodePtr) ent;

            /*
             * Downstream code like the nginx xslt module can set
             * ctxt->myDoc->extSubset to a separate DTD, so the entity
             * might have a different or a NULL document.
             */
            if (list->doc != ent->doc)
                xmlSetTreeDoc(list, ent->doc);

            if (list->next == NULL)
                ent->last = list;
            list = list->next;
        }
    } else {
        xmlFreeNodeList(list);
    }

    xmlFreeInputStream(input);

error:
    ent->flags |= XML_ENT_PARSED | XML_ENT_CHECKED;
}